

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall
piksel::Graphics::image
          (Graphics *this,Image *img,float dx,float dy,float dWidth,float dHeight,float sx,float sy,
          float sWidth,float sHeight)

{
  ShaderRelevantState *pSVar1;
  Image *v;
  undefined1 local_12c [76];
  undefined1 local_e0 [16];
  mat<4,_4,_float,_(glm::qualifier)0> local_d0;
  mat<4,_4,_float,_(glm::qualifier)0> local_90;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_50;
  State *local_40;
  State *state;
  float sHeight_local;
  float sWidth_local;
  float sy_local;
  float sx_local;
  float dHeight_local;
  float dWidth_local;
  float dy_local;
  float dx_local;
  Image *img_local;
  Graphics *this_local;
  
  state._0_4_ = sHeight;
  state._4_4_ = sWidth;
  sHeight_local = sy;
  sWidth_local = sx;
  sy_local = dHeight;
  sx_local = dWidth;
  dHeight_local = dy;
  dWidth_local = dx;
  _dy_local = img;
  img_local = (Image *)this;
  push(this);
  local_40 = peek(this);
  if (((local_40->shaderIrrelevantState).tint & 1U) == 0) {
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&local_50.field_0,1.0);
    *(undefined8 *)&(local_40->shaderRelevantState).tintColor.field_0 = local_50._0_8_;
    *(undefined8 *)((long)&(local_40->shaderRelevantState).tintColor.field_0 + 8) = local_50._8_8_;
  }
  (local_40->shaderIrrelevantState).rectMode = (local_40->shaderIrrelevantState).imageMode;
  (*glad_glActiveTexture)(_dy_local->_index % 8 + 0x84c0);
  v = _dy_local;
  (*glad_glBindTexture)
            (0xde1,(GLuint)(((anon_union_12_4_ea85571f_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                            &_dy_local->_texture)->field_0).x);
  local_e0._12_4_ = 1.0;
  glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_d0,(float *)(local_e0 + 0xc));
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)local_e0,sWidth_local / (float)_dy_local->width,
             (((float)_dy_local->height - sHeight_local) - state._0_4_) / (float)_dy_local->height,
             0.0);
  glm::translate<float,(glm::qualifier)0>
            (&local_90,(glm *)&local_d0,(mat<4,_4,_float,_(glm::qualifier)0> *)local_e0,
             (vec<3,_float,_(glm::qualifier)0> *)v);
  memcpy(&(local_40->shaderRelevantState).textureMatrix,&local_90,0x40);
  pSVar1 = &local_40->shaderRelevantState;
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)local_12c,state._4_4_ / (float)_dy_local->width,
             state._0_4_ / (float)_dy_local->height,1.0);
  glm::scale<float,(glm::qualifier)0>
            ((mat<4,_4,_float,_(glm::qualifier)0> *)(local_12c + 0xc),(glm *)&pSVar1->textureMatrix,
             (mat<4,_4,_float,_(glm::qualifier)0> *)local_12c,(vec<3,_float,_(glm::qualifier)0> *)v)
  ;
  memcpy(&(local_40->shaderRelevantState).textureMatrix,local_12c + 0xc,0x40);
  (local_40->shaderRelevantState).textureIndex = (float)(_dy_local->_index % 8);
  _rect(this,dWidth_local,dHeight_local,sx_local,sy_local);
  pop(this);
  return;
}

Assistant:

void Graphics::image(Image& img, float dx, float dy, float dWidth, float dHeight, float sx, float sy, float sWidth, float sHeight) {
    push();
    State& state = peek();
    if (!state.shaderIrrelevantState.tint) {
        state.shaderRelevantState.tintColor = glm::vec4(1.0f);
    }
    state.shaderIrrelevantState.rectMode = state.shaderIrrelevantState.imageMode;
    glActiveTexture(GL_TEXTURE0 + (img._index % 8));
	glBindTexture(GL_TEXTURE_2D, img._texture);
	state.shaderRelevantState.textureMatrix = glm::translate(glm::mat4(1.0f), glm::vec3(sx / img.width, (img.height - sy - sHeight) / img.height, 0.0f));
	state.shaderRelevantState.textureMatrix = glm::scale(state.shaderRelevantState.textureMatrix, glm::vec3(sWidth / img.width, sHeight / img.height, 1.0f));
    // state.shaderRelevantState.textureMatrix = glm::mat4(1.0f); // for debug
    state.shaderRelevantState.textureIndex = img._index % 8;
    _rect(dx, dy, dWidth, dHeight);
    pop();
}